

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String __thiscall testing::internal::String::Format(String *this,char *format,...)

{
  int iVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  String SVar3;
  int size;
  int kBufferSize;
  char buffer [4096];
  va_list args;
  char *format_local;
  
  buffer[0xffc] = '0';
  buffer[0xffd] = '\0';
  buffer[0xffe] = '\0';
  buffer[0xfff] = '\0';
  buffer[0xff8] = '\x10';
  buffer[0xff9] = '\0';
  buffer[0xffa] = '\0';
  buffer[0xffb] = '\0';
  iVar1 = vsnprintf((char *)&size,0x1000,format,buffer + 0xff8);
  if ((iVar1 < 0) || (0xfff < iVar1)) {
    String(this,"<formatting error or buffer exceeded>");
    sVar2 = extraout_RDX;
  }
  else {
    String(this,(char *)&size,(long)iVar1);
    sVar2 = extraout_RDX_00;
  }
  SVar3.length_ = sVar2;
  SVar3.c_str_ = (char *)this;
  return SVar3;
}

Assistant:

String String::Format(const char * format, ...) {
  va_list args;
  va_start(args, format);

  char buffer[4096];
  const int kBufferSize = sizeof(buffer)/sizeof(buffer[0]);

  // MSVC 8 deprecates vsnprintf(), so we want to suppress warning
  // 4996 (deprecated function) there.
#ifdef _MSC_VER  // We are using MSVC.
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4996)  // Temporarily disables warning 4996.

  const int size = vsnprintf(buffer, kBufferSize, format, args);

# pragma warning(pop)           // Restores the warning state.
#else  // We are not using MSVC.
  const int size = vsnprintf(buffer, kBufferSize, format, args);
#endif  // _MSC_VER
  va_end(args);

  // vsnprintf()'s behavior is not portable.  When the buffer is not
  // big enough, it returns a negative value in MSVC, and returns the
  // needed buffer size on Linux.  When there is an output error, it
  // always returns a negative value.  For simplicity, we lump the two
  // error cases together.
  if (size < 0 || size >= kBufferSize) {
    return String("<formatting error or buffer exceeded>");
  } else {
    return String(buffer, size);
  }
}